

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

token * handle_attributes(dmr_C *C,token *token,decl_state *ctx,uint keywords)

{
  symbol *psVar1;
  keyword kVar2;
  
  kVar2 = keywords;
  while( true ) {
    if (((ulong)token->pos & 0x3f) != 2) {
      return token;
    }
    psVar1 = dmrC_lookup_keyword((token->field_2).ident,NS_KEYWORD|NS_TYPEDEF);
    if (psVar1 == (symbol *)0x0) {
      return token;
    }
    if (*(char *)psVar1 != '\x11') {
      return token;
    }
    if ((psVar1->op->type & kVar2) == 0) break;
    token = (*psVar1->op->declarator)(C,token->next,ctx);
    kVar2 = keywords & KW_ATTRIBUTE;
  }
  return token;
}

Assistant:

static struct token *handle_attributes(struct dmr_C *C, struct token *token, struct decl_state *ctx, unsigned int keywords)
{
	struct symbol *keyword;
	for (;;) {
		if (dmrC_token_type(token) != TOKEN_IDENT)
			break;
		keyword = dmrC_lookup_keyword(token->ident, NS_KEYWORD | NS_TYPEDEF);
		if (!keyword || keyword->type != SYM_KEYWORD)
			break;
		if (!(keyword->op->type & keywords))
			break;
		token = keyword->op->declarator(C, token->next, ctx);
		keywords &= KW_ATTRIBUTE;
	}
	return token;
}